

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O0

psa_status_t psa_get_empty_key_slot(psa_key_handle_t *handle,psa_key_slot_t **p_slot)

{
  int iVar1;
  psa_key_slot_t **p_slot_local;
  psa_key_handle_t *handle_local;
  
  if ((global_data._1536_1_ & 1) == 0) {
    handle_local._4_4_ = -0x89;
  }
  else {
    *handle = 0x20;
    while (*handle != 0) {
      *p_slot = global_data.key_slots + (int)(*handle - 1);
      iVar1 = psa_is_key_slot_occupied(*p_slot);
      if (iVar1 == 0) {
        return 0;
      }
      *handle = *handle - 1;
    }
    *p_slot = (psa_key_slot_t *)0x0;
    handle_local._4_4_ = -0x8d;
  }
  return handle_local._4_4_;
}

Assistant:

psa_status_t psa_get_empty_key_slot( psa_key_handle_t *handle,
                                             psa_key_slot_t **p_slot )
{
    if( ! global_data.key_slots_initialized )
        return( PSA_ERROR_BAD_STATE );

    for( *handle = PSA_KEY_SLOT_COUNT; *handle != 0; --( *handle ) )
    {
        *p_slot = &global_data.key_slots[*handle - 1];
        if( ! psa_is_key_slot_occupied( *p_slot ) )
            return( PSA_SUCCESS );
    }
    *p_slot = NULL;
    return( PSA_ERROR_INSUFFICIENT_MEMORY );
}